

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O3

void __thiscall
MapState::addGuard(MapState *this,LoadGuard *guard,OpCode opc,TypeFactory *typeFactory)

{
  int iVar1;
  PcodeOp *pPVar2;
  pointer ppVVar3;
  Datatype *ct;
  int iVar4;
  int s;
  Varnode **ppVVar5;
  uintb st;
  int4 hi;
  
  pPVar2 = guard->op;
  if ((((pPVar2->flags & 0x20) == 0) && (pPVar2->opcode->opcode == opc)) &&
     (s = guard->step, s != 0)) {
    ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ct = ppVVar3[1]->type;
    if (ct->metatype == TYPE_PTR) {
      do {
        ct = (Datatype *)ct[1]._vptr_Datatype;
      } while (ct->metatype == TYPE_ARRAY);
    }
    ppVVar5 = &pPVar2->output;
    if (opc == CPUI_STORE) {
      ppVVar5 = ppVVar3 + 2;
    }
    iVar1 = (*ppVVar5)->size;
    if ((iVar1 == s) || ((iVar1 <= s && (iVar4 = s % iVar1, s = iVar1, iVar4 == 0)))) {
      if (ct->size != s) {
        if (8 < s) {
          return;
        }
        ct = TypeFactory::getBase(typeFactory,s,TYPE_UNKNOWN);
      }
      if (guard->analysisState == 2) {
        st = guard->minimumOffset;
        hi = (int)(((guard->maximumOffset - st) + 1) / (ulong)(long)s) + -1;
      }
      else {
        st = guard->minimumOffset;
        hi = 3;
      }
      addRange(this,st,ct,0,open,hi);
      return;
    }
  }
  return;
}

Assistant:

void MapState::addGuard(const LoadGuard &guard,OpCode opc,TypeFactory *typeFactory)

{
  if (!guard.isValid(opc)) return;
  int4 step = guard.getStep();
  if (step == 0) return;		// No definitive sign of array access
  Datatype *ct = guard.getOp()->getIn(1)->getType();
  if (ct->getMetatype() == TYPE_PTR) {
    ct = ((TypePointer *) ct)->getPtrTo();
    while (ct->getMetatype() == TYPE_ARRAY)
      ct = ((TypeArray *) ct)->getBase();
  }
  int4 outSize;
  if (opc == CPUI_STORE)
    outSize = guard.getOp()->getIn(2)->getSize();	// The Varnode being stored
  else
    outSize = guard.getOp()->getOut()->getSize();	// The Varnode being loaded
  if (outSize != step) {
    // LOAD size doesn't match step:  field in array of structures or something more unusual
    if (outSize > step || (step % outSize) != 0)
      return;
    // Since the LOAD size divides the step and we want to preserve the arrayness
    // we pretend we have an array of LOAD's size
    step = outSize;
  }
  if (ct->getSize() != step) {	// Make sure data-type matches our step size
    if (step > 8)
      return;		// Don't manufacture primitives bigger than 8-bytes
    ct = typeFactory->getBase(step, TYPE_UNKNOWN);
  }
  if (guard.isRangeLocked()) {
    int4 minItems = ((guard.getMaximum() - guard.getMinimum()) + 1) / step;
    addRange(guard.getMinimum(),ct,0,RangeHint::open,minItems-1);
  }
  else
    addRange(guard.getMinimum(),ct,0,RangeHint::open,3);
}